

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O0

RecyclerTestObject * __thiscall Location::Get(Location *this)

{
  ImplicitRootHolder *holder;
  Location *this_local;
  
  switch(this->type) {
  case Scanned:
    this_local = (Location *)*this->location;
    break;
  case Rooted:
    this_local = (Location *)*this->location;
    break;
  case Barrier:
    this_local = (Location *)*this->location;
    break;
  case Tagged:
    this_local = (Location *)Untag(*this->location);
    break;
  case ImplicitRoot:
    if (*this->location == (RecyclerTestObject *)0x0) {
      this_local = (Location *)0x0;
    }
    else {
      this_local = (Location *)
                   ImplicitRootHolder::GetReference((ImplicitRootHolder *)*this->location);
    }
    break;
  default:
    DoVerify(false,"false",
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/GCStress.h"
             ,0x6d);
    this_local = (Location *)0x0;
  }
  return (RecyclerTestObject *)this_local;
}

Assistant:

RecyclerTestObject * Get()
    {
        switch (type)
        {
            case Type::Scanned:
                return *location;

            case Type::Rooted:
                return *location;

            case Type::Barrier:
                return *location;

            case Type::Tagged:
                return Untag(*location);

            case Type::ImplicitRoot:
                // The stored location actually contains a pointer to the ImplicitRootHolder
                ImplicitRootHolder * holder = (ImplicitRootHolder *)(*location);
                if (holder == nullptr)
                {
                    return nullptr;
                }

                return holder->GetReference();
        }

        // Shouldn't get here
        VerifyCondition(false);
        return nullptr;
    }